

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.c
# Opt level: O1

fnode_service_state_t fnode_service_init_handler(fnode_service_t *svc)

{
  size_t num;
  _Bool _Var1;
  uint32_t uVar2;
  ulong uVar3;
  fnet_socket_t *es;
  ulong uVar4;
  fnet_socket_t *rs;
  fnet_socket_t afStack_e0 [2];
  size_t sStack_d8;
  fnet_socket_t afStack_d0 [2];
  undefined1 local_c8 [8];
  fnet_address_t broadcast_addr;
  size_t es_num;
  size_t rs_num;
  fcmd_hello cmd;
  
  afStack_d0[0] = 0x102848;
  afStack_d0[1] = 0;
  _Var1 = fnet_str2addr("255.255.255.255:9999",(fnet_address_t *)local_c8);
  if (_Var1) {
    rs_num._0_4_ = 0x4f4c4548;
    rs_num._4_4_ = (undefined4)*(undefined8 *)svc->sn;
    cmd.cmd = SUB84((ulong)*(undefined8 *)svc->sn >> 0x20,0);
    cmd.sn._0_4_ = *(undefined4 *)svc->dev_type;
    uVar3 = svc->ifaces_num;
    if (uVar3 != 0) {
      uVar4 = 0;
      do {
        afStack_d0[0] = 0x10289c;
        afStack_d0[1] = 0;
        fnet_socket_sendto(svc->ifaces[uVar4],(char *)&rs_num,0x10,(fnet_address_t *)local_c8);
        uVar4 = uVar4 + 1;
        uVar3 = svc->ifaces_num;
      } while (uVar4 < uVar3);
    }
    rs = (fnet_socket_t *)(local_c8 + -(uVar3 * 4 + 0xf & 0xfffffffffffffff0));
    num = svc->ifaces_num;
    es = (fnet_socket_t *)((long)rs - (num * 4 + 0xf & 0xfffffffffffffff0));
    es_num = 0;
    broadcast_addr.__ss_align = 0;
    es[-4] = 1000;
    es[-3] = 0;
    es[-6] = 0x102904;
    es[-5] = 0;
    _Var1 = fnet_socket_select(svc->ifaces,num,rs,&es_num,es,&broadcast_addr.__ss_align,
                               *(size_t *)(es + -4));
    if ((_Var1) && (es_num != 0)) {
      svc->socket = *rs;
      es[-2] = 0x102921;
      es[-1] = 0;
      uVar2 = fnode_service_recv_cmd(svc);
      if (uVar2 == 0x464e4f43) {
        return FSVC_NOTIFY_STATUS;
      }
    }
  }
  return FSVC_INIT;
}

Assistant:

fnode_service_state_t fnode_service_init_handler(fnode_service_t *svc)
{
    // get broadcast address
    fnet_address_t broadcast_addr;
    if (!fnet_str2addr(FNODE_BROADCAST_ADDR, &broadcast_addr))
    {
        FLOG_ERR("Invalid broadcast address");
        return FSVC_INIT;
    }

    // prepare command buffer
    fcmd_hello cmd = {{ FCMD_CHARS(FCMD_HELO) }};
    memcpy(cmd.sn,       svc->sn,       sizeof svc->sn);
    memcpy(cmd.dev_type, svc->dev_type, sizeof svc->dev_type);

    // broadcast hello message to each interface
    for(size_t i = 0; i < svc->ifaces_num; ++i)
        fnet_socket_sendto(svc->ifaces[i], (const char *)&cmd, sizeof cmd, &broadcast_addr);

    fnet_socket_t rs[svc->ifaces_num], es[svc->ifaces_num];
    size_t rs_num = 0, es_num = 0;
    if (fnet_socket_select(svc->ifaces, svc->ifaces_num, rs, &rs_num, es, &es_num, FNODE_HELLO_FREQ) && rs_num)
    {
        if (rs_num)
            svc->socket = rs[0];
        if (fnode_service_recv_cmd(svc) == FCMD_CONF)
            return FSVC_NOTIFY_STATUS;
    }

    return FSVC_INIT;
}